

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandBlast(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Wlc_Ntk_t *pNtk_00;
  Vec_Int_t *pVVar5;
  Gia_Man_t *p;
  FILE *__stream;
  void *pvVar6;
  char *pcVar7;
  FILE *pFile;
  char *pName;
  int i;
  Gia_Man_t *pTemp;
  int CountM;
  int CountA;
  Wlc_BstPar_t *pPar;
  Wlc_BstPar_t Par;
  int fPrintInputInfo;
  int fDumpNames;
  int fMiter;
  int c;
  Gia_Man_t *pNew;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Wlc_AbcGetNtk(pAbc);
  bVar2 = false;
  Par.vBoxIds._4_4_ = 0;
  Par.vBoxIds._0_4_ = 0;
  _CountM = (Wlc_BstPar_t *)&pPar;
  Wlc_BstParDefault(_CountM);
  _CountM->nOutputRange = 2;
  Extra_UtilGetoptReset();
LAB_003e90bf:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"ORAMcombqadestnizvh");
    if (iVar3 == -1) {
      if (pNtk_00 == (Wlc_Ntk_t *)0x0) {
        Abc_Print(1,"Abc_CommandBlast(): There is no current design.\n");
        return 0;
      }
      if (pNtk_00->fAsyncRst != 0) {
        Abc_Print(1,"Abc_CommandBlast(): Trying to bit-blast network with asynchronous reset.\n");
        return 0;
      }
      if ((uint)Par.vBoxIds != 0) {
        Wlc_NtkPrintInputInfo(pNtk_00);
      }
      if (_CountM->fMulti == 0) {
        if ((_CountM->nAdderLimit != 0) || (_CountM->nMultLimit != 0)) {
          pVVar5 = Wlc_NtkCollectAddMult(pNtk_00,_CountM,(int *)((long)&pTemp + 4),(int *)&pTemp);
          _CountM->vBoxIds = pVVar5;
          if (_CountM->vBoxIds == (Vec_Int_t *)0x0) {
            Abc_Print(1,"Warning:  There is no adders and multipliers that will not be blasted.\n");
          }
          else {
            Abc_Print(1,"Warning:  %d adders and %d multipliers will not be blasted.\n",
                      (ulong)pTemp._4_4_,(ulong)(uint)pTemp);
          }
        }
      }
      else {
        pVVar5 = Wlc_NtkCollectMultipliers(pNtk_00);
        _CountM->vBoxIds = pVVar5;
        if (_CountM->vBoxIds == (Vec_Int_t *)0x0) {
          Abc_Print(1,"Warning:  There is no multipliers in the design.\n");
        }
      }
      if ((-1 < _CountM->iOutput) &&
         (iVar3 = _CountM->iOutput, iVar1 = _CountM->nOutputRange, iVar4 = Wlc_NtkPoNum(pNtk_00),
         iVar4 < iVar3 + iVar1)) {
        Abc_Print(1,"Abc_CommandBlast(): The output range [%d:%d] is incorrect.\n",
                  (ulong)(uint)_CountM->iOutput,
                  (ulong)((_CountM->iOutput + _CountM->nOutputRange) - 1));
        return 0;
      }
      p = Wlc_NtkBitBlast(pNtk_00,_CountM);
      Vec_IntFreeP(&_CountM->vBoxIds);
      if (p == (Gia_Man_t *)0x0) {
        Abc_Print(1,"Abc_CommandBlast(): Bit-blasting has failed.\n");
        return 0;
      }
      _fMiter = p;
      if (bVar2) {
        _fMiter = Gia_ManTransformMiter(p);
        Gia_ManStop(p);
        Abc_Print(1,
                  "Bit-blasting created a traditional multi-output miter by XORing POs pair-wise.\n"
                 );
        if (Par.vBoxIds._4_4_ != 0) {
          __stream = fopen("pio_name_map.txt","wb");
          if (_fMiter->vNamesIn != (Vec_Ptr_t *)0x0) {
            for (pName._4_4_ = 0; iVar3 = Vec_PtrSize(_fMiter->vNamesIn), (int)pName._4_4_ < iVar3;
                pName._4_4_ = pName._4_4_ + 1) {
              pvVar6 = Vec_PtrEntry(_fMiter->vNamesIn,pName._4_4_);
              fprintf(__stream,"i%d %s\n",(ulong)pName._4_4_,pvVar6);
            }
          }
          if (_fMiter->vNamesOut != (Vec_Ptr_t *)0x0) {
            for (pName._4_4_ = 0; iVar3 = Vec_PtrSize(_fMiter->vNamesOut), (int)pName._4_4_ < iVar3;
                pName._4_4_ = pName._4_4_ + 1) {
              pvVar6 = Vec_PtrEntry(_fMiter->vNamesOut,pName._4_4_);
              fprintf(__stream,"o%d %s\n",(ulong)pName._4_4_,pvVar6);
            }
          }
          fclose(__stream);
          Abc_Print(1,"Finished dumping file \"pio_name_map.txt\" containing PI/PO name mapping.\n")
          ;
        }
      }
      Abc_FrameUpdateGia(pAbc,_fMiter);
      return 0;
    }
    switch(iVar3) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_003e97fc;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      _CountM->nAdderLimit = iVar3;
      iVar3 = _CountM->nAdderLimit;
      break;
    default:
      goto LAB_003e97fc;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_003e97fc;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      _CountM->nMultLimit = iVar3;
      iVar3 = _CountM->nMultLimit;
      break;
    case 0x4f:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
        goto LAB_003e97fc;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      _CountM->iOutput = iVar3;
      iVar3 = _CountM->iOutput;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_003e97fc;
      }
      iVar3 = atoi(argv[globalUtilOptind]);
      _CountM->nOutputRange = iVar3;
      iVar3 = _CountM->nOutputRange;
      break;
    case 0x61:
      _CountM->fCla = _CountM->fCla ^ 1;
      goto LAB_003e90bf;
    case 0x62:
      _CountM->fBooth = _CountM->fBooth ^ 1;
      goto LAB_003e90bf;
    case 99:
      _CountM->fGiaSimple = _CountM->fGiaSimple ^ 1;
      goto LAB_003e90bf;
    case 100:
      _CountM->fCreateMiter = _CountM->fCreateMiter ^ 1;
      goto LAB_003e90bf;
    case 0x65:
      _CountM->fCreateWordMiter = _CountM->fCreateWordMiter ^ 1;
      goto LAB_003e90bf;
    case 0x68:
      goto LAB_003e97fc;
    case 0x69:
      Par.vBoxIds._0_4_ = (uint)Par.vBoxIds ^ 1;
      goto LAB_003e90bf;
    case 0x6d:
      _CountM->fMulti = _CountM->fMulti ^ 1;
      goto LAB_003e90bf;
    case 0x6e:
      Par.vBoxIds._4_4_ = Par.vBoxIds._4_4_ ^ 1;
      goto LAB_003e90bf;
    case 0x6f:
      _CountM->fAddOutputs = _CountM->fAddOutputs ^ 1;
      goto LAB_003e90bf;
    case 0x71:
      _CountM->fNonRest = _CountM->fNonRest ^ 1;
      goto LAB_003e90bf;
    case 0x73:
      _CountM->fDecMuxes = _CountM->fDecMuxes ^ 1;
      goto LAB_003e90bf;
    case 0x74:
      _CountM->fCreateMiter = _CountM->fCreateMiter ^ 1;
      bVar2 = (bool)(bVar2 ^ 1);
      goto LAB_003e90bf;
    case 0x76:
      _CountM->fVerbose = _CountM->fVerbose ^ 1;
      goto LAB_003e90bf;
    case 0x7a:
      _CountM->fSaveFfNames = _CountM->fSaveFfNames ^ 1;
      goto LAB_003e90bf;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar3 < 0) {
LAB_003e97fc:
      Abc_Print(-2,"usage: %%blast [-ORAM num] [-combqadestnizvh]\n");
      Abc_Print(-2,"\t         performs bit-blasting of the word-level design\n");
      Abc_Print(-2,
                "\t-O num : zero-based index of the first word-level PO to bit-blast [default = %d]\n"
                ,(ulong)(uint)_CountM->iOutput);
      Abc_Print(-2,"\t-R num : the total number of word-level POs to bit-blast [default = %d]\n",
                (ulong)(uint)_CountM->nOutputRange);
      Abc_Print(-2,"\t-A num : blast adders smaller than this (0 = unused) [default = %d]\n",
                (ulong)(uint)_CountM->nAdderLimit);
      Abc_Print(-2,"\t-M num : blast multipliers smaller than this (0 = unused) [default = %d]\n",
                (ulong)(uint)_CountM->nMultLimit);
      pcVar7 = "no";
      if (_CountM->fGiaSimple != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n",
                pcVar7);
      pcVar7 = "no";
      if (_CountM->fAddOutputs != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (_CountM->fMulti != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n"
                ,pcVar7);
      pcVar7 = "no";
      if (_CountM->fBooth != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle generating radix-4 Booth multipliers [default = %s]\n",pcVar7)
      ;
      pcVar7 = "no";
      if (_CountM->fNonRest != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-q     : toggle generating non-restoring square root [default = %s]\n",pcVar7)
      ;
      pcVar7 = "no";
      if (_CountM->fCla != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle generating carry-look-ahead adder [default = %s]\n",pcVar7);
      pcVar7 = "no";
      if (_CountM->fCreateMiter != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle creating dual-output multi-output miter [default = %s]\n",
                pcVar7);
      pcVar7 = "no";
      if (_CountM->fCreateWordMiter != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,
                "\t-e     : toggle creating miter with output word bits combined [default = %s]\n",
                pcVar7);
      pcVar7 = "no";
      if (_CountM->fDecMuxes != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle creating decoded MUXes [default = %s]\n",pcVar7);
      pcVar7 = "no";
      if (bVar2) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-t     : toggle creating regular multi-output miter [default = %s]\n",pcVar7);
      pcVar7 = "no";
      if (Par.vBoxIds._4_4_ != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle dumping signal names into a text file [default = %s]\n",pcVar7
               );
      pcVar7 = "no";
      if ((uint)Par.vBoxIds != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-i     : toggle to print input names after blasting [default = %s]\n",pcVar7);
      pcVar7 = "no";
      if (_CountM->fSaveFfNames != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-z     : toggle saving flop names after blasting [default = %s]\n",pcVar7);
      pcVar7 = "no";
      if (_CountM->fVerbose != 0) {
        pcVar7 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar7);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandBlast( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Wlc_NtkPrintInputInfo( Wlc_Ntk_t * pNtk );
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Gia_Man_t * pNew = NULL; int c, fMiter = 0, fDumpNames = 0, fPrintInputInfo = 0;
    Wlc_BstPar_t Par, * pPar = &Par;
    Wlc_BstParDefault( pPar );
    pPar->nOutputRange = 2;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORAMcombqadestnizvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->iOutput < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nOutputRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nOutputRange < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nAdderLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nAdderLimit < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPar->nMultLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPar->nMultLimit < 0 )
                goto usage;
            break;
        case 'c':
            pPar->fGiaSimple ^= 1;
            break;
        case 'o':
            pPar->fAddOutputs ^= 1;
            break;
        case 'm':
            pPar->fMulti ^= 1;
            break;
        case 'b':
            pPar->fBooth ^= 1;
            break;
        case 'q':
            pPar->fNonRest ^= 1;
            break;
        case 'a':
            pPar->fCla ^= 1;
            break;
        case 'd':
            pPar->fCreateMiter ^= 1;
            break;
        case 'e':
            pPar->fCreateWordMiter ^= 1;
            break;
        case 's':
            pPar->fDecMuxes ^= 1;
            break;
        case 't':
            pPar->fCreateMiter ^= 1;
            fMiter ^= 1;
            break;
        case 'n':
            fDumpNames ^= 1;
            break;
        case 'i': 
            fPrintInputInfo ^= 1; 
            break;
        case 'z': 
            pPar->fSaveFfNames ^= 1; 
            break;
        case 'v':
            pPar->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): There is no current design.\n" );
        return 0;
    }
    if ( pNtk->fAsyncRst )
    {
        Abc_Print( 1, "Abc_CommandBlast(): Trying to bit-blast network with asynchronous reset.\n" );
        return 0;
    }
    if ( fPrintInputInfo )
        Wlc_NtkPrintInputInfo(pNtk); 
    if ( pPar->fMulti )
    {
        pPar->vBoxIds = Wlc_NtkCollectMultipliers( pNtk );
        if ( pPar->vBoxIds == NULL )
            Abc_Print( 1, "Warning:  There is no multipliers in the design.\n" );
    }
    else if ( pPar->nAdderLimit || pPar->nMultLimit )
    {
        int CountA, CountM;
        pPar->vBoxIds = Wlc_NtkCollectAddMult( pNtk, pPar, &CountA, &CountM );
        if ( pPar->vBoxIds == NULL )
            Abc_Print( 1, "Warning:  There is no adders and multipliers that will not be blasted.\n" );
        else 
            Abc_Print( 1, "Warning:  %d adders and %d multipliers will not be blasted.\n", CountA, CountM );
    }
    if ( pPar->iOutput >= 0 && pPar->iOutput + pPar->nOutputRange > Wlc_NtkPoNum(pNtk) )
    {
        Abc_Print( 1, "Abc_CommandBlast(): The output range [%d:%d] is incorrect.\n", pPar->iOutput, pPar->iOutput + pPar->nOutputRange - 1 );
        return 0;
    }
    // transform
    pNew = Wlc_NtkBitBlast( pNtk, pPar );
    Vec_IntFreeP( &pPar->vBoxIds );
    if ( pNew == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): Bit-blasting has failed.\n" );
        return 0;
    }
    // generate miter
    if ( fMiter )
    {
        Gia_Man_t * pTemp = pNew;
        pNew = Gia_ManTransformMiter( pNew );
        Gia_ManStop( pTemp );
        Abc_Print( 1, "Bit-blasting created a traditional multi-output miter by XORing POs pair-wise.\n" );
        if ( fDumpNames )
        {
            int i; char * pName;
            FILE * pFile = fopen( "pio_name_map.txt", "wb" );
            if ( pNew->vNamesIn )
                Vec_PtrForEachEntry( char *, pNew->vNamesIn, pName, i )
                    fprintf( pFile, "i%d %s\n", i, pName );
            if ( pNew->vNamesOut )
                Vec_PtrForEachEntry( char *, pNew->vNamesOut, pName, i )
                    fprintf( pFile, "o%d %s\n", i, pName );
            fclose( pFile );
            Abc_Print( 1, "Finished dumping file \"pio_name_map.txt\" containing PI/PO name mapping.\n" );
        }
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: %%blast [-ORAM num] [-combqadestnizvh]\n" );
    Abc_Print( -2, "\t         performs bit-blasting of the word-level design\n" );
    Abc_Print( -2, "\t-O num : zero-based index of the first word-level PO to bit-blast [default = %d]\n", pPar->iOutput );
    Abc_Print( -2, "\t-R num : the total number of word-level POs to bit-blast [default = %d]\n",          pPar->nOutputRange );
    Abc_Print( -2, "\t-A num : blast adders smaller than this (0 = unused) [default = %d]\n",              pPar->nAdderLimit );
    Abc_Print( -2, "\t-M num : blast multipliers smaller than this (0 = unused) [default = %d]\n",         pPar->nMultLimit );
    Abc_Print( -2, "\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n",     pPar->fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n", pPar->fAddOutputs? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n",  pPar->fMulti? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle generating radix-4 Booth multipliers [default = %s]\n",              pPar->fBooth? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle generating non-restoring square root [default = %s]\n",              pPar->fNonRest? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle generating carry-look-ahead adder [default = %s]\n",                 pPar->fCla? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle creating dual-output multi-output miter [default = %s]\n",           pPar->fCreateMiter? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle creating miter with output word bits combined [default = %s]\n",     pPar->fCreateWordMiter? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle creating decoded MUXes [default = %s]\n",                            pPar->fDecMuxes? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle creating regular multi-output miter [default = %s]\n",               fMiter? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle dumping signal names into a text file [default = %s]\n",             fDumpNames? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle to print input names after blasting [default = %s]\n",               fPrintInputInfo ? "yes": "no" );
    Abc_Print( -2, "\t-z     : toggle saving flop names after blasting [default = %s]\n",                  pPar->fSaveFfNames ? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                      pPar->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}